

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O1

void embree::avx512::InstanceArrayIntersectorK<16>::intersect
               (vbool<16> *valid_i,Precalculations *pre,RayHitK<16> *ray,RayQueryContext *context,
               Primitive_conflict4 *prim)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  uint uVar5;
  Geometry *pGVar6;
  RTCRayQueryContext *pRVar7;
  long *plVar8;
  long lVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  ulong uVar12;
  _func_int *p_Var13;
  ushort uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  vfloat4 a0_2;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vfloat4 a0;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 in_ZMM1 [64];
  undefined4 uVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_ZMM2 [64];
  int iVar49;
  vfloat4 a0_1;
  undefined1 auVar50 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 in_ZMM4 [64];
  vfloat4 b0;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float fVar68;
  float fVar69;
  vfloat4 a1;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  RayQueryContext newcontext;
  vint<16> mask;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [2] [64];
  
  auVar21 = in_ZMM4._0_16_;
  a0.field_0 = in_ZMM1._0_16_;
  a0_1.field_0 = in_ZMM3._0_16_;
  auVar20 = in_ZMM2._0_16_;
  uVar5 = prim->primID_;
  pGVar6 = (context->scene->geometries).items[prim->instID_].ptr;
  p_Var13 = *(_func_int **)&pGVar6->field_0x58;
  if (p_Var13 == (_func_int *)0x0) {
    uVar12 = (ulong)*(uint *)(*(long *)&pGVar6[1].time_range.upper +
                             (long)pGVar6[1].intersectionFilterN * (ulong)uVar5);
    if (uVar12 == 0xffffffff) {
      p_Var13 = (_func_int *)0x0;
    }
    else {
      p_Var13 = pGVar6[1].super_RefCount._vptr_RefCount[uVar12];
    }
  }
  if (p_Var13 != (_func_int *)0x0) {
    auVar25 = vpbroadcastd_avx512f(ZEXT416(pGVar6->mask));
    auVar16 = auVar25._0_16_;
    uVar10 = vptestmd_avx512f(auVar25,*(undefined1 (*) [64])(ray + 0x240));
    uVar14 = (ushort)uVar10 & valid_i->v;
    if ((uVar14 != 0) && (pRVar7 = context->user, pRVar7->instID[0] == 0xffffffff)) {
      pRVar7->instID[0] = prim->instID_;
      pRVar7->instPrimID[0] = uVar5;
      uVar12 = (ulong)prim->primID_;
      plVar8 = *(long **)&pGVar6[1].fnumTimeSegments;
      iVar49 = (int)plVar8[4];
      if ((pGVar6->field_8).field_0x1 == '\x01') {
        if (iVar49 == 0x9134) {
          lVar9 = *plVar8;
          lVar15 = uVar12 * plVar8[2];
          auVar20 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + lVar15)),
                                  ZEXT416(*(uint *)(lVar9 + 0x10 + lVar15)),0x1c);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar20,ZEXT416(*(uint *)(lVar9 + 0x20 + lVar15)),0x28);
          auVar20 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + 4 + lVar15)),
                                  ZEXT416(*(uint *)(lVar9 + 0x14 + lVar15)),0x1c);
          auVar21 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(lVar9 + 0x24 + lVar15)),0x28);
          auVar20 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + 8 + lVar15)),
                                  ZEXT416(*(uint *)(lVar9 + 0x18 + lVar15)),0x1c);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vinsertps_avx(auVar20,ZEXT416(*(uint *)(lVar9 + 0x28 + lVar15)),0x28);
          auVar20 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + 0xc + lVar15)),
                                  ZEXT416(*(uint *)(lVar9 + 0x1c + lVar15)),0x1c);
          auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(lVar9 + 0x2c + lVar15)),0x28);
        }
        else if (iVar49 == 0x9234) {
          lVar9 = *plVar8;
          lVar15 = uVar12 * plVar8[2];
          auVar21._8_8_ = 0;
          auVar21._0_8_ = *(ulong *)(lVar9 + 4 + lVar15);
          auVar18._8_8_ = 0;
          auVar18._0_8_ = *(ulong *)(lVar9 + 0x10 + lVar15);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar9 + lVar15)),_DAT_02060e80,auVar21);
          auVar21 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar9 + 0xc + lVar15)),_DAT_02060e80,
                                       auVar18);
          auVar16._8_8_ = 0;
          auVar16._0_8_ = *(ulong *)(lVar9 + 0x1c + lVar15);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar9 + 0x18 + lVar15)),_DAT_02060e80,
                                            auVar16);
          auVar17._8_8_ = 0;
          auVar17._0_8_ = *(ulong *)(lVar9 + 0x28 + lVar15);
          auVar20 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar9 + 0x24 + lVar15)),_DAT_02060e80,
                                       auVar17);
        }
        else if (iVar49 == 0xb001) {
          lVar9 = *plVar8;
          lVar15 = uVar12 * plVar8[2];
          auVar42._8_8_ = 0;
          auVar42._0_8_ = *(ulong *)(lVar9 + 0x10 + lVar15);
          auVar21 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(lVar9 + 8 + lVar15)),0x20);
          auVar24._8_8_ = 0;
          auVar24._0_8_ = *(ulong *)(lVar9 + 0x34 + lVar15);
          auVar16 = vpermt2ps_avx512vl(auVar24,_DAT_02060e90,ZEXT416(*(uint *)(lVar9 + lVar15)));
          auVar56._8_8_ = 0;
          auVar56._0_8_ = *(ulong *)(lVar9 + 0x1c + lVar15);
          fVar64 = *(float *)(lVar9 + 0x24 + lVar15);
          fVar68 = *(float *)(lVar9 + 0x28 + lVar15);
          fVar69 = *(float *)(lVar9 + 0x2c + lVar15);
          auVar17 = vpermt2ps_avx512vl(auVar56,_DAT_02060e90,
                                       ZEXT416(*(uint *)(lVar9 + 0x18 + lVar15)));
          fVar70 = *(float *)(lVar9 + 0x30 + lVar15);
          auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar68 * fVar68)),ZEXT416((uint)fVar64),
                                    ZEXT416((uint)fVar64));
          auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar69),ZEXT416((uint)fVar69));
          auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar70),ZEXT416((uint)fVar70));
          auVar18 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar20._0_4_));
          fVar57 = auVar18._0_4_;
          fVar57 = fVar57 * 1.5 + fVar57 * fVar57 * fVar57 * auVar20._0_4_ * -0.5;
          auVar20 = vinsertps_avx(auVar17,ZEXT416((uint)(fVar57 * fVar64)),0x30);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar16,ZEXT416((uint)(fVar57 * fVar68)),0x30);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vinsertps_avx(auVar21,ZEXT416((uint)(fVar57 * fVar70)),0x30);
          auVar21 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + 0xc + lVar15)),
                                  ZEXT416(*(uint *)(lVar9 + 4 + lVar15)),0x10);
          auVar21 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(lVar9 + 0x3c + lVar15)),0x20);
          auVar21 = vinsertps_avx(auVar21,ZEXT416((uint)(fVar69 * fVar57)),0x30);
        }
        else if (iVar49 == 0x9244) {
          lVar9 = *plVar8;
          lVar15 = uVar12 * plVar8[2];
          a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar9 + lVar15))->v;
          auVar21 = *(undefined1 (*) [16])(lVar9 + 0x10 + lVar15);
          a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                          ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar9 + 0x20 + lVar15))
                          ->v;
          auVar20 = *(undefined1 (*) [16])(lVar9 + 0x30 + lVar15);
        }
        auVar16 = vshufps_avx(auVar20,auVar20,0xff);
        auVar18 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
        auVar42 = vshufps_avx(auVar21,auVar21,0xff);
        auVar24 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
        auVar17 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])0x0,0xe9);
        auVar17 = vblendps_avx(auVar17,auVar21,4);
        fVar61 = auVar18._0_4_;
        auVar56 = vfmadd213ss_fma(auVar16,auVar16,ZEXT416((uint)(fVar61 * fVar61)));
        auVar56 = vfnmadd231ss_fma(auVar56,auVar42,auVar42);
        auVar19 = vfnmadd231ss_fma(auVar56,auVar24,auVar24);
        fVar57 = auVar16._0_4_;
        auVar22 = ZEXT416((uint)(auVar24._0_4_ * fVar57));
        auVar56 = vfmadd213ss_fma(auVar42,auVar18,auVar22);
        fVar64 = auVar56._0_4_ + auVar56._0_4_;
        auVar52 = ZEXT416((uint)(auVar42._0_4_ * fVar57));
        auVar56 = vfmsub213ss_fma(auVar24,auVar18,auVar52);
        fVar68 = auVar56._0_4_ + auVar56._0_4_;
        auVar56 = vfmsub231ss_fma(auVar22,auVar18,auVar42);
        fVar69 = auVar56._0_4_ + auVar56._0_4_;
        auVar56 = vfmsub231ss_fma(ZEXT416((uint)(fVar61 * fVar61)),auVar16,auVar16);
        auVar16 = vfmadd213ss_avx512f(auVar42,auVar42,auVar56);
        auVar22 = vfnmadd231ss_avx512f(auVar16,auVar24,auVar24);
        auVar16 = vfmadd213ss_avx512f(auVar24,auVar42,ZEXT416((uint)(fVar61 * fVar57)));
        auVar23 = vaddss_avx512f(auVar16,auVar16);
        auVar16 = vfmadd213ss_fma(auVar18,auVar24,auVar52);
        fVar70 = auVar16._0_4_ + auVar16._0_4_;
        auVar16 = vfmsub231ss_fma(ZEXT416((uint)(fVar61 * fVar57)),auVar42,auVar24);
        fVar57 = auVar16._0_4_ + auVar16._0_4_;
        auVar16 = vfnmadd231ss_fma(auVar56,auVar42,auVar42);
        auVar18 = vfmadd231ss_fma(auVar16,auVar24,auVar24);
        uVar45 = auVar19._0_4_;
        auVar65._4_4_ = uVar45;
        auVar65._0_4_ = uVar45;
        auVar65._8_4_ = uVar45;
        auVar65._12_4_ = uVar45;
        auVar71._4_4_ = fVar64;
        auVar71._0_4_ = fVar64;
        auVar71._8_4_ = fVar64;
        auVar71._12_4_ = fVar64;
        auVar73._0_4_ = fVar68 * 0.0;
        auVar73._4_4_ = fVar68 * 0.0;
        auVar73._8_4_ = fVar68 * 1.0;
        auVar73._12_4_ = fVar68 * 0.0;
        auVar56 = ZEXT816(0x3f80000000000000);
        auVar16 = vfmadd231ps_fma(auVar73,auVar56,auVar71);
        auVar19 = SUB6416(ZEXT464(0x3f800000),0);
        auVar42 = vfmadd231ps_fma(auVar16,auVar19,auVar65);
        auVar66._4_4_ = fVar69;
        auVar66._0_4_ = fVar69;
        auVar66._8_4_ = fVar69;
        auVar66._12_4_ = fVar69;
        auVar16 = vbroadcastss_avx512vl(auVar22);
        auVar24 = vbroadcastss_avx512vl(auVar23);
        auVar72._0_4_ = auVar24._0_4_ * 0.0;
        auVar72._4_4_ = auVar24._4_4_ * 0.0;
        auVar72._8_4_ = auVar24._8_4_ * 1.0;
        auVar72._12_4_ = auVar24._12_4_ * 0.0;
        auVar16 = vfmadd231ps_fma(auVar72,auVar56,auVar16);
        auVar24 = vfmadd231ps_fma(auVar16,auVar19,auVar66);
        auVar62._4_4_ = fVar70;
        auVar62._0_4_ = fVar70;
        auVar62._8_4_ = fVar70;
        auVar62._12_4_ = fVar70;
        auVar59._4_4_ = fVar57;
        auVar59._0_4_ = fVar57;
        auVar59._8_4_ = fVar57;
        auVar59._12_4_ = fVar57;
        fVar64 = auVar18._0_4_;
        auVar67._0_4_ = fVar64 * 0.0;
        auVar67._4_4_ = fVar64 * 0.0;
        auVar67._8_4_ = fVar64 * 1.0;
        auVar67._12_4_ = fVar64 * 0.0;
        auVar16 = vfmadd231ps_fma(auVar67,auVar56,auVar59);
        auVar16 = vfmadd231ps_fma(auVar16,auVar19,auVar62);
        auVar19._0_4_ = a0.field_0._0_4_;
        auVar19._4_4_ = auVar19._0_4_;
        auVar19._8_4_ = auVar19._0_4_;
        auVar19._12_4_ = auVar19._0_4_;
        fVar64 = auVar16._0_4_;
        auVar60._0_4_ = fVar64 * 0.0;
        fVar68 = auVar16._4_4_;
        auVar60._4_4_ = fVar68 * 0.0;
        fVar69 = auVar16._8_4_;
        auVar60._8_4_ = fVar69 * 0.0;
        fVar70 = auVar16._12_4_;
        auVar60._12_4_ = fVar70 * 0.0;
        auVar16 = vfmadd213ps_fma((undefined1  [16])0x0,auVar24,auVar60);
        auVar16 = vfmadd231ps_fma(auVar16,auVar42,auVar19);
        uVar45 = auVar21._0_4_;
        auVar63._4_4_ = uVar45;
        auVar63._0_4_ = uVar45;
        auVar63._8_4_ = uVar45;
        auVar63._12_4_ = uVar45;
        auVar21 = vshufps_avx(auVar21,auVar21,0x55);
        auVar21 = vfmadd213ps_fma(auVar21,auVar24,auVar60);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar21,auVar42,auVar63);
        iVar49 = a0_1.field_0._0_4_;
        auVar52._4_4_ = iVar49;
        auVar52._0_4_ = iVar49;
        auVar52._8_4_ = iVar49;
        auVar52._12_4_ = iVar49;
        auVar21 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0x55);
        auVar18 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xaa);
        auVar23._0_4_ = fVar64 * auVar18._0_4_;
        auVar23._4_4_ = fVar68 * auVar18._4_4_;
        auVar23._8_4_ = fVar69 * auVar18._8_4_;
        auVar23._12_4_ = fVar70 * auVar18._12_4_;
        auVar21 = vfmadd231ps_fma(auVar23,auVar24,auVar21);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vfmadd231ps_fma(auVar21,auVar42,auVar52);
        uVar45 = auVar20._0_4_;
        auVar53._4_4_ = uVar45;
        auVar53._0_4_ = uVar45;
        auVar53._8_4_ = uVar45;
        auVar53._12_4_ = uVar45;
        auVar21 = vshufps_avx(auVar20,auVar20,0x55);
        auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
        auVar22._0_4_ = fVar64 * auVar20._0_4_;
        auVar22._4_4_ = fVar68 * auVar20._4_4_;
        auVar22._8_4_ = fVar69 * auVar20._8_4_;
        auVar22._12_4_ = fVar70 * auVar20._12_4_;
        auVar20 = vfmadd231ps_fma(auVar22,auVar24,auVar21);
        auVar21 = vfmadd231ps_fma(auVar20,auVar42,auVar53);
        auVar20._0_4_ = auVar17._0_4_ + 0.0 + auVar21._0_4_;
        auVar20._4_4_ = auVar17._4_4_ + 0.0 + auVar21._4_4_;
        auVar20._8_4_ = auVar17._8_4_ + 0.0 + auVar21._8_4_;
        auVar20._12_4_ = auVar17._12_4_ + 0.0 + auVar21._12_4_;
      }
      else if (iVar49 == 0x9134) {
        lVar9 = *plVar8;
        lVar15 = uVar12 * plVar8[2];
        auVar20 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + lVar15)),
                                ZEXT416(*(uint *)(lVar9 + 0x10 + lVar15)),0x1c);
        auVar16 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(lVar9 + 0x20 + lVar15)),0x28);
        auVar20 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + 4 + lVar15)),
                                ZEXT416(*(uint *)(lVar9 + 0x14 + lVar15)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar20,ZEXT416(*(uint *)(lVar9 + 0x24 + lVar15)),0x28);
        auVar20 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + 8 + lVar15)),
                                ZEXT416(*(uint *)(lVar9 + 0x18 + lVar15)),0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar20,ZEXT416(*(uint *)(lVar9 + 0x28 + lVar15)),0x28);
        auVar20 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + 0xc + lVar15)),
                                ZEXT416(*(uint *)(lVar9 + 0x1c + lVar15)),0x1c);
        auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(lVar9 + 0x2c + lVar15)),0x28);
      }
      else if (iVar49 == 0x9234) {
        lVar9 = *plVar8;
        lVar15 = uVar12 * plVar8[2];
        auVar46._8_8_ = 0;
        auVar46._0_8_ = *(ulong *)(lVar9 + 4 + lVar15);
        auVar50._8_8_ = 0;
        auVar50._0_8_ = *(ulong *)(lVar9 + 0x10 + lVar15);
        auVar16 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar9 + lVar15)),_DAT_02060e80,auVar46);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar9 + 0xc + lVar15)),_DAT_02060e80,
                                        auVar50);
        auVar47._8_8_ = 0;
        auVar47._0_8_ = *(ulong *)(lVar9 + 0x1c + lVar15);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar9 + 0x18 + lVar15)),_DAT_02060e80,
                                          auVar47);
        auVar54._8_8_ = 0;
        auVar54._0_8_ = *(ulong *)(lVar9 + 0x28 + lVar15);
        auVar20 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar9 + 0x24 + lVar15)),_DAT_02060e80,auVar54
                                    );
      }
      else if (iVar49 == 0xb001) {
        lVar9 = *plVar8;
        lVar15 = uVar12 * plVar8[2];
        auVar39._8_8_ = 0;
        auVar39._0_8_ = *(ulong *)(lVar9 + 0x10 + lVar15);
        auVar21 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(lVar9 + 8 + lVar15)),0x20);
        auVar40._8_8_ = 0;
        auVar40._0_8_ = *(ulong *)(lVar9 + 0x34 + lVar15);
        auVar16 = vpermt2ps_avx512vl(auVar40,_DAT_02060e90,ZEXT416(*(uint *)(lVar9 + lVar15)));
        auVar55._8_8_ = 0;
        auVar55._0_8_ = *(ulong *)(lVar9 + 0x1c + lVar15);
        fVar64 = *(float *)(lVar9 + 0x24 + lVar15);
        fVar68 = *(float *)(lVar9 + 0x28 + lVar15);
        fVar69 = *(float *)(lVar9 + 0x2c + lVar15);
        auVar17 = vpermt2ps_avx512vl(auVar55,_DAT_02060e90,ZEXT416(*(uint *)(lVar9 + 0x18 + lVar15))
                                    );
        fVar70 = *(float *)(lVar9 + 0x30 + lVar15);
        auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar68 * fVar68)),ZEXT416((uint)fVar64),
                                  ZEXT416((uint)fVar64));
        auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar69),ZEXT416((uint)fVar69));
        auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar70),ZEXT416((uint)fVar70));
        auVar18 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar20._0_4_));
        fVar57 = auVar18._0_4_;
        fVar57 = fVar57 * 1.5 + fVar57 * fVar57 * fVar57 * auVar20._0_4_ * -0.5;
        auVar20 = vinsertps_avx(auVar17,ZEXT416((uint)(fVar57 * fVar64)),0x30);
        auVar16 = vinsertps_avx(auVar16,ZEXT416((uint)(fVar57 * fVar68)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar21,ZEXT416((uint)(fVar57 * fVar70)),0x30);
        auVar21 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + 0xc + lVar15)),
                                ZEXT416(*(uint *)(lVar9 + 4 + lVar15)),0x10);
        auVar21 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(lVar9 + 0x3c + lVar15)),0x20);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar21,ZEXT416((uint)(fVar69 * fVar57)),0x30);
      }
      else if (iVar49 == 0x9244) {
        lVar9 = *plVar8;
        lVar15 = uVar12 * plVar8[2];
        auVar16 = *(undefined1 (*) [16])(lVar9 + lVar15);
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar9 + 0x10 + lVar15))->v;
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar9 + 0x20 + lVar15))->
                        v;
        auVar20 = *(undefined1 (*) [16])(lVar9 + 0x30 + lVar15);
      }
      auVar21 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xc9);
      auVar17 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xc9);
      auVar58._0_4_ = a0_1.field_0._0_4_ * auVar17._0_4_;
      auVar58._4_4_ = a0_1.field_0._4_4_ * auVar17._4_4_;
      auVar58._8_4_ = a0_1.field_0._8_4_ * auVar17._8_4_;
      auVar58._12_4_ = a0_1.field_0._12_4_ * auVar17._12_4_;
      auVar24 = vfmsub231ps_fma(auVar58,(undefined1  [16])a0.field_0,auVar21);
      auVar18 = vshufps_avx(auVar24,auVar24,0xc9);
      auVar42 = vshufps_avx(auVar16,auVar16,0xc9);
      auVar51._0_4_ = auVar16._0_4_ * auVar21._0_4_;
      auVar51._4_4_ = auVar16._4_4_ * auVar21._4_4_;
      auVar51._8_4_ = auVar16._8_4_ * auVar21._8_4_;
      auVar51._12_4_ = auVar16._12_4_ * auVar21._12_4_;
      auVar56 = vfmsub231ps_fma(auVar51,auVar42,(undefined1  [16])a0_1.field_0);
      auVar43._0_4_ = auVar42._0_4_ * a0.field_0._0_4_;
      auVar43._4_4_ = auVar42._4_4_ * a0.field_0._4_4_;
      auVar43._8_4_ = auVar42._8_4_ * a0.field_0._8_4_;
      auVar43._12_4_ = auVar42._12_4_ * a0.field_0._12_4_;
      auVar21 = vfmsub231ps_fma(auVar43,auVar16,auVar17);
      auVar19 = vpermi2ps_avx512vl(_DAT_02064980,auVar18,auVar21);
      auVar17 = vunpcklps_avx(auVar24,auVar21);
      auVar21 = vinsertps_avx(auVar56,auVar56,0x4a);
      auVar42 = vunpcklps_avx(auVar17,ZEXT416(auVar56._0_4_));
      auVar24 = vunpcklps_avx(auVar19,auVar21);
      auVar17 = vunpckhps_avx(auVar19,auVar21);
      auVar21 = vdpps_avx(auVar16,auVar18,0x7f);
      auVar41._0_4_ = auVar21._0_4_;
      auVar41._4_4_ = auVar41._0_4_;
      auVar41._8_4_ = auVar41._0_4_;
      auVar41._12_4_ = auVar41._0_4_;
      auVar21 = vdivps_avx(auVar24,auVar41);
      auVar16 = vdivps_avx(auVar17,auVar41);
      auVar17 = vdivps_avx(auVar42,auVar41);
      uVar45 = auVar20._0_4_;
      auVar44._4_4_ = uVar45;
      auVar44._0_4_ = uVar45;
      auVar44._8_4_ = uVar45;
      auVar44._12_4_ = uVar45;
      auVar18 = vshufps_avx(auVar20,auVar20,0x55);
      auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
      auVar48._0_4_ = auVar20._0_4_ * auVar17._0_4_;
      auVar48._4_4_ = auVar20._4_4_ * auVar17._4_4_;
      auVar48._8_4_ = auVar20._8_4_ * auVar17._8_4_;
      auVar48._12_4_ = auVar20._12_4_ * auVar17._12_4_;
      auVar20 = vfmadd231ps_fma(auVar48,auVar16,auVar18);
      auVar20 = vfmadd231ps_fma(auVar20,auVar21,auVar44);
      auVar11._8_4_ = 0x80000000;
      auVar11._0_8_ = 0x8000000080000000;
      auVar11._12_4_ = 0x80000000;
      auVar20 = vxorps_avx512vl(auVar20,auVar11);
      auVar25 = vbroadcastss_avx512f(ZEXT416(1));
      auVar26 = vbroadcastss_avx512f(auVar21);
      auVar27 = vpermps_avx512f(auVar25,ZEXT1664(auVar21));
      auVar28 = vbroadcastss_avx512f(ZEXT416(2));
      auVar29 = vpermps_avx512f(auVar28,ZEXT1664(auVar21));
      auVar30 = vbroadcastss_avx512f(auVar16);
      auVar31 = vpermps_avx512f(auVar25,ZEXT1664(auVar16));
      auVar32 = vpermps_avx512f(auVar28,ZEXT1664(auVar16));
      auVar33 = vbroadcastss_avx512f(auVar17);
      auVar34 = vpermps_avx512f(auVar25,ZEXT1664(auVar17));
      auVar35 = vpermps_avx512f(auVar28,ZEXT1664(auVar17));
      auVar36 = vbroadcastss_avx512f(auVar20);
      auVar37 = vpermps_avx512f(auVar25,ZEXT1664(auVar20));
      auVar38 = vpermps_avx512f(auVar28,ZEXT1664(auVar20));
      auVar25 = *(undefined1 (*) [64])ray;
      auVar28 = *(undefined1 (*) [64])(ray + 0x40);
      auVar1 = *(undefined1 (*) [64])(ray + 0x80);
      auVar2 = *(undefined1 (*) [64])(ray + 0x100);
      auVar3 = *(undefined1 (*) [64])(ray + 0x140);
      auVar4 = *(undefined1 (*) [64])(ray + 0x180);
      auVar36 = vfmadd231ps_avx512f(auVar36,auVar1,auVar33);
      auVar37 = vfmadd231ps_avx512f(auVar37,auVar1,auVar34);
      auVar38 = vfmadd231ps_avx512f(auVar38,auVar1,auVar35);
      auVar36 = vfmadd231ps_avx512f(auVar36,auVar28,auVar30);
      auVar37 = vfmadd231ps_avx512f(auVar37,auVar28,auVar31);
      auVar38 = vfmadd231ps_avx512f(auVar38,auVar28,auVar32);
      auVar36 = vfmadd231ps_avx512f(auVar36,auVar25,auVar26);
      auVar37 = vfmadd231ps_avx512f(auVar37,auVar25,auVar27);
      *(undefined1 (*) [64])ray = auVar36;
      auVar36 = vfmadd231ps_avx512f(auVar38,auVar25,auVar29);
      *(undefined1 (*) [64])(ray + 0x40) = auVar37;
      *(undefined1 (*) [64])(ray + 0x80) = auVar36;
      auVar33 = vmulps_avx512f(auVar4,auVar33);
      auVar34 = vmulps_avx512f(auVar4,auVar34);
      auVar35 = vmulps_avx512f(auVar4,auVar35);
      auVar30 = vfmadd231ps_avx512f(auVar33,auVar3,auVar30);
      auVar31 = vfmadd231ps_avx512f(auVar34,auVar3,auVar31);
      auVar32 = vfmadd231ps_avx512f(auVar35,auVar3,auVar32);
      auVar26 = vfmadd231ps_avx512f(auVar30,auVar2,auVar26);
      auVar27 = vfmadd231ps_avx512f(auVar31,auVar2,auVar27);
      auVar29 = vfmadd231ps_avx512f(auVar32,auVar2,auVar29);
      *(undefined1 (*) [64])(ray + 0x100) = auVar26;
      *(undefined1 (*) [64])(ray + 0x140) = auVar27;
      *(undefined1 (*) [64])(ray + 0x180) = auVar29;
      auVar26 = vpmovm2d_avx512dq((ulong)uVar14);
      local_c0[0] = vmovdqa64_avx512f(auVar26);
      (**(code **)(p_Var13 + 0x128))(local_c0,p_Var13 + 0x58,ray);
      local_180 = auVar25._0_8_;
      uStack_178 = auVar25._8_8_;
      uStack_170 = auVar25._16_8_;
      uStack_168 = auVar25._24_8_;
      uStack_160 = auVar25._32_8_;
      uStack_158 = auVar25._40_8_;
      uStack_150 = auVar25._48_8_;
      uStack_148 = auVar25._56_8_;
      *(undefined8 *)ray = local_180;
      *(undefined8 *)(ray + 8) = uStack_178;
      *(undefined8 *)(ray + 0x10) = uStack_170;
      *(undefined8 *)(ray + 0x18) = uStack_168;
      *(undefined8 *)(ray + 0x20) = uStack_160;
      *(undefined8 *)(ray + 0x28) = uStack_158;
      *(undefined8 *)(ray + 0x30) = uStack_150;
      *(undefined8 *)(ray + 0x38) = uStack_148;
      local_140 = auVar28._0_8_;
      uStack_138 = auVar28._8_8_;
      uStack_130 = auVar28._16_8_;
      uStack_128 = auVar28._24_8_;
      uStack_120 = auVar28._32_8_;
      uStack_118 = auVar28._40_8_;
      uStack_110 = auVar28._48_8_;
      uStack_108 = auVar28._56_8_;
      *(undefined8 *)(ray + 0x40) = local_140;
      *(undefined8 *)(ray + 0x48) = uStack_138;
      *(undefined8 *)(ray + 0x50) = uStack_130;
      *(undefined8 *)(ray + 0x58) = uStack_128;
      *(undefined8 *)(ray + 0x60) = uStack_120;
      *(undefined8 *)(ray + 0x68) = uStack_118;
      *(undefined8 *)(ray + 0x70) = uStack_110;
      *(undefined8 *)(ray + 0x78) = uStack_108;
      local_100 = auVar1._0_8_;
      uStack_f8 = auVar1._8_8_;
      uStack_f0 = auVar1._16_8_;
      uStack_e8 = auVar1._24_8_;
      uStack_e0 = auVar1._32_8_;
      uStack_d8 = auVar1._40_8_;
      uStack_d0 = auVar1._48_8_;
      uStack_c8 = auVar1._56_8_;
      *(undefined8 *)(ray + 0x80) = local_100;
      *(undefined8 *)(ray + 0x88) = uStack_f8;
      *(undefined8 *)(ray + 0x90) = uStack_f0;
      *(undefined8 *)(ray + 0x98) = uStack_e8;
      *(undefined8 *)(ray + 0xa0) = uStack_e0;
      *(undefined8 *)(ray + 0xa8) = uStack_d8;
      *(undefined8 *)(ray + 0xb0) = uStack_d0;
      *(undefined8 *)(ray + 0xb8) = uStack_c8;
      local_240 = auVar2._0_8_;
      uStack_238 = auVar2._8_8_;
      uStack_230 = auVar2._16_8_;
      uStack_228 = auVar2._24_8_;
      uStack_220 = auVar2._32_8_;
      uStack_218 = auVar2._40_8_;
      uStack_210 = auVar2._48_8_;
      uStack_208 = auVar2._56_8_;
      *(undefined8 *)(ray + 0x100) = local_240;
      *(undefined8 *)(ray + 0x108) = uStack_238;
      *(undefined8 *)(ray + 0x110) = uStack_230;
      *(undefined8 *)(ray + 0x118) = uStack_228;
      *(undefined8 *)(ray + 0x120) = uStack_220;
      *(undefined8 *)(ray + 0x128) = uStack_218;
      *(undefined8 *)(ray + 0x130) = uStack_210;
      *(undefined8 *)(ray + 0x138) = uStack_208;
      local_200 = auVar3._0_8_;
      uStack_1f8 = auVar3._8_8_;
      uStack_1f0 = auVar3._16_8_;
      uStack_1e8 = auVar3._24_8_;
      uStack_1e0 = auVar3._32_8_;
      uStack_1d8 = auVar3._40_8_;
      uStack_1d0 = auVar3._48_8_;
      uStack_1c8 = auVar3._56_8_;
      *(undefined8 *)(ray + 0x140) = local_200;
      *(undefined8 *)(ray + 0x148) = uStack_1f8;
      *(undefined8 *)(ray + 0x150) = uStack_1f0;
      *(undefined8 *)(ray + 0x158) = uStack_1e8;
      *(undefined8 *)(ray + 0x160) = uStack_1e0;
      *(undefined8 *)(ray + 0x168) = uStack_1d8;
      *(undefined8 *)(ray + 0x170) = uStack_1d0;
      *(undefined8 *)(ray + 0x178) = uStack_1c8;
      auVar25 = vmovdqa64_avx512f(auVar4);
      auVar25 = vmovdqa64_avx512f(auVar25);
      *(undefined1 (*) [64])(ray + 0x180) = auVar25;
      pRVar7->instID[0] = 0xffffffff;
      pRVar7->instPrimID[0] = 0xffffffff;
    }
  }
  return;
}

Assistant:

void InstanceArrayIntersectorK<K>::intersect(const vbool<K>& valid_i, const Precalculations& pre, RayHitK<K>& ray, RayQueryContext* context, const Primitive& prim)
    {
      vbool<K> valid = valid_i;
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3vf<K> world2local = instance->getWorld2Local(prim.primID_);
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.intersect(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }